

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_manager.cpp
# Opt level: O2

void __thiscall cff::ColorManager::SetColors(ColorManager *this,Color fgCol,Color bgCol)

{
  ColorManager *this_00;
  
  if (fgCol != RESET) {
    SetBgColor(this,bgCol);
    SetFgColor(this,fgCol);
    return;
  }
  this_00 = (ColorManager *)&std::cout;
  std::operator<<((ostream *)&std::cout,"\x1b[0m");
  SetBgColor(this_00,bgCol);
  return;
}

Assistant:

void ColorManager::SetColors(Color fgCol, Color bgCol) {
        if(fgCol == Color::RESET) {
            SetFgColor(fgCol);
            SetBgColor(bgCol);
        } else {
            SetBgColor(bgCol);
            SetFgColor(fgCol);
        }
    }